

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamClient.cpp
# Opt level: O0

bool __thiscall
VViconCGStreamClient::ReadObjectEnums
          (VViconCGStreamClient *this,VCGStreamReaderWriter *i_rReaderWriter)

{
  bool bVar1;
  Enum EVar2;
  undefined1 local_60 [8];
  VScopedReader Object;
  undefined1 local_38 [8];
  VScopedReader Objects;
  VCGStreamReaderWriter *i_rReaderWriter_local;
  VViconCGStreamClient *this_local;
  
  Objects._16_8_ = i_rReaderWriter;
  bVar1 = VCGStreamReaderWriter::Fill(i_rReaderWriter);
  if (bVar1) {
    ViconCGStreamIO::VScopedReader::VScopedReader
              ((VScopedReader *)local_38,(VBuffer *)Objects._16_8_);
    EVar2 = ViconCGStreamIO::VScopedReader::Enum((VScopedReader *)local_38);
    if (EVar2 == 0x1a2b0001) {
      do {
        bVar1 = ViconCGStreamIO::VScopedReader::Ok((VScopedReader *)local_38);
        if (!bVar1) {
          this_local._7_1_ = 0;
          Object.m_End = 1;
          break;
        }
        ViconCGStreamIO::VScopedReader::VScopedReader
                  ((VScopedReader *)local_60,(VBuffer *)Objects._16_8_);
        EVar2 = ViconCGStreamIO::VScopedReader::Enum((VScopedReader *)local_60);
        if (EVar2 == 0x186a1) {
          bVar1 = ViconCGStreamIO::VScopedReader::Read
                            ((VScopedReader *)local_60,&(this->m_ServerObjects).super_VItem);
          if (bVar1) {
            this->m_bEnumsChanged = true;
            this_local._7_1_ = 1;
            Object.m_End = 1;
          }
          else {
            this_local._7_1_ = 0;
            Object.m_End = 1;
          }
        }
        else {
          Object.m_End = 0;
        }
        ViconCGStreamIO::VScopedReader::~VScopedReader((VScopedReader *)local_60);
      } while (Object.m_End == 0);
    }
    else {
      this_local._7_1_ = 0;
      Object.m_End = 1;
    }
    ViconCGStreamIO::VScopedReader::~VScopedReader((VScopedReader *)local_38);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool VViconCGStreamClient::ReadObjectEnums( VCGStreamReaderWriter& i_rReaderWriter )
{
  if( !i_rReaderWriter.Fill() )
  {
    return false;
  }

  ViconCGStreamIO::VScopedReader Objects( i_rReaderWriter );
  if( Objects.Enum() != ViconCGStreamEnum::Objects )
  {
    return false;
  }

  while( Objects.Ok() )
  {
    ViconCGStreamIO::VScopedReader Object( i_rReaderWriter );

    if( Object.Enum() == ViconCGStreamEnum::ObjectEnums )
    {
      if( !Object.Read( m_ServerObjects ) )
      {
        return false;
      }

      m_bEnumsChanged = true;
      return true;
    }
  }

  return false;
}